

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5WriteAppendTerm(Fts5Index *p,Fts5SegWriter *pWriter,int nTerm,u8 *pTerm)

{
  int iVar1;
  Fts5Index *p_00;
  Fts5SegWriter *pWriter_00;
  u8 *in_RCX;
  u32 in_EDX;
  long in_RSI;
  long *in_RDI;
  int n;
  int nMin;
  Fts5Buffer *pPgidx;
  Fts5PageWriter *pPage;
  int nPrefix;
  undefined4 in_stack_ffffffffffffffb8;
  u32 uVar2;
  u32 in_stack_ffffffffffffffc0;
  u32 nData;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  
  uVar3 = 0xaaaaaaaa;
  p_00 = (Fts5Index *)(in_RSI + 8);
  pWriter_00 = (Fts5SegWriter *)(in_RSI + 0x20);
  uVar2 = in_EDX;
  if (*(int *)(in_RSI + 0x38) < (int)in_EDX) {
    uVar2 = *(u32 *)(in_RSI + 0x38);
  }
  nData = uVar2;
  if (*(int *)(*in_RDI + 0xc4) <=
      (int)(*(int *)(in_RSI + 0x18) + *(int *)(in_RSI + 0x28) + in_EDX + 2)) {
    if ((4 < *(int *)(in_RSI + 0x18)) &&
       (fts5WriteFlushLeaf(p_00,pWriter_00), *(int *)((long)in_RDI + 0x3c) != 0)) {
      return;
    }
    if (*(uint *)&p_00->field_0x14 < p_00->nWorkUnit + in_EDX + 0x14) {
      sqlite3Fts5BufferSize
                ((int *)CONCAT44(uVar3,in_stack_ffffffffffffffd8),(Fts5Buffer *)p_00,
                 (u32)((ulong)pWriter_00 >> 0x20));
    }
  }
  iVar1 = sqlite3Fts5PutVarint((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),0x278efd);
  (pWriter_00->writer).pgno = iVar1 + (pWriter_00->writer).pgno;
  *(int *)((long)&p_00->pConfig + 4) = p_00->nWorkUnit;
  if (*(char *)(in_RSI + 0x4a) == '\0') {
    fts5PrefixCompress(nData,(u8 *)p_00->iWriteRowid,in_RCX);
    sqlite3Fts5BufferAppendVarint
              ((int *)CONCAT44(nData,in_stack_ffffffffffffffc0),
               (Fts5Buffer *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),0x278fd7);
  }
  else if (*(int *)&p_00->pConfig != 1) {
    if (p_00->bDelete != 0) {
      iVar1 = fts5PrefixCompress(nData,(u8 *)p_00->iWriteRowid,in_RCX);
      in_EDX = iVar1 + 1;
    }
    fts5WriteBtreeTerm(p_00,pWriter_00,nData,(u8 *)CONCAT44(uVar2,in_stack_ffffffffffffffb8));
    if (*(int *)((long)in_RDI + 0x3c) != 0) {
      return;
    }
    p_00 = (Fts5Index *)(in_RSI + 8);
    in_stack_ffffffffffffffc0 = in_EDX;
  }
  sqlite3Fts5BufferAppendVarint
            ((int *)CONCAT44(nData,in_stack_ffffffffffffffc0),
             (Fts5Buffer *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),0x278ffb);
  sqlite3Fts5BufferAppendBlob
            ((int *)p_00,(Fts5Buffer *)pWriter_00,nData,
             (u8 *)CONCAT44(uVar2,in_stack_ffffffffffffffb8));
  sqlite3Fts5BufferSet
            ((int *)p_00,(Fts5Buffer *)pWriter_00,nData,
             (u8 *)CONCAT44(uVar2,in_stack_ffffffffffffffb8));
  *(undefined1 *)(in_RSI + 0x4a) = 0;
  *(undefined1 *)(in_RSI + 0x49) = 0;
  *(undefined1 *)(in_RSI + 0x48) = 1;
  **(undefined4 **)(in_RSI + 0x58) = *(undefined4 *)&p_00->pConfig;
  return;
}

Assistant:

static void fts5WriteAppendTerm(
  Fts5Index *p,
  Fts5SegWriter *pWriter,
  int nTerm, const u8 *pTerm
){
  int nPrefix;                    /* Bytes of prefix compression for term */
  Fts5PageWriter *pPage = &pWriter->writer;
  Fts5Buffer *pPgidx = &pWriter->writer.pgidx;
  int nMin = MIN(pPage->term.n, nTerm);

  assert( p->rc==SQLITE_OK );
  assert( pPage->buf.n>=4 );
  assert( pPage->buf.n>4 || pWriter->bFirstTermInPage );

  /* If the current leaf page is full, flush it to disk. */
  if( (pPage->buf.n + pPgidx->n + nTerm + 2)>=p->pConfig->pgsz ){
    if( pPage->buf.n>4 ){
      fts5WriteFlushLeaf(p, pWriter);
      if( p->rc!=SQLITE_OK ) return;
    }
    fts5BufferGrow(&p->rc, &pPage->buf, nTerm+FTS5_DATA_PADDING);
  }

  /* TODO1: Updating pgidx here. */
  pPgidx->n += sqlite3Fts5PutVarint(
      &pPgidx->p[pPgidx->n], pPage->buf.n - pPage->iPrevPgidx
  );
  pPage->iPrevPgidx = pPage->buf.n;
#if 0
  fts5PutU16(&pPgidx->p[pPgidx->n], pPage->buf.n);
  pPgidx->n += 2;
#endif

  if( pWriter->bFirstTermInPage ){
    nPrefix = 0;
    if( pPage->pgno!=1 ){
      /* This is the first term on a leaf that is not the leftmost leaf in
      ** the segment b-tree. In this case it is necessary to add a term to
      ** the b-tree hierarchy that is (a) larger than the largest term
      ** already written to the segment and (b) smaller than or equal to
      ** this term. In other words, a prefix of (pTerm/nTerm) that is one
      ** byte longer than the longest prefix (pTerm/nTerm) shares with the
      ** previous term.
      **
      ** Usually, the previous term is available in pPage->term. The exception
      ** is if this is the first term written in an incremental-merge step.
      ** In this case the previous term is not available, so just write a
      ** copy of (pTerm/nTerm) into the parent node. This is slightly
      ** inefficient, but still correct.  */
      int n = nTerm;
      if( pPage->term.n ){
        n = 1 + fts5PrefixCompress(nMin, pPage->term.p, pTerm);
      }
      fts5WriteBtreeTerm(p, pWriter, n, pTerm);
      if( p->rc!=SQLITE_OK ) return;
      pPage = &pWriter->writer;
    }
  }else{
    nPrefix = fts5PrefixCompress(nMin, pPage->term.p, pTerm);
    fts5BufferAppendVarint(&p->rc, &pPage->buf, nPrefix);
  }

  /* Append the number of bytes of new data, then the term data itself
  ** to the page. */
  fts5BufferAppendVarint(&p->rc, &pPage->buf, nTerm - nPrefix);
  fts5BufferAppendBlob(&p->rc, &pPage->buf, nTerm - nPrefix, &pTerm[nPrefix]);

  /* Update the Fts5PageWriter.term field. */
  fts5BufferSet(&p->rc, &pPage->term, nTerm, pTerm);
  pWriter->bFirstTermInPage = 0;

  pWriter->bFirstRowidInPage = 0;
  pWriter->bFirstRowidInDoclist = 1;

  assert( p->rc || (pWriter->nDlidx>0 && pWriter->aDlidx[0].buf.n==0) );
  pWriter->aDlidx[0].pgno = pPage->pgno;
}